

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::FastGtS2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  ushort uVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  MessageLite *pMVar5;
  ulong uVar6;
  string *psVar7;
  char *pcVar8;
  ushort *puVar9;
  int iVar10;
  ushort *puVar11;
  undefined8 uVar12;
  uint *puVar13;
  undefined8 uVar14;
  Arena *arena;
  undefined8 uVar15;
  int iVar16;
  long *plVar17;
  ushort *local_58 [2];
  long local_48;
  long local_40;
  long local_38;
  
  if (data.field_0._0_2_ != 0) {
    pcVar8 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar8;
  }
  uVar1 = *(ushort *)ptr;
  if ((ulong)table->has_bits_offset != 0) {
    puVar13 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
    if (((ulong)puVar13 & 3) != 0) {
      AlignFail(puVar13);
    }
    *puVar13 = *puVar13 | (uint)hasbits | (uint)(1L << (data.field_0._2_1_ & 0x3f));
  }
  plVar17 = (long *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)plVar17 & 7) != 0) {
    AlignFail(plVar17);
  }
  lVar2 = *(long *)((long)&table->has_bits_offset +
                   ((ulong)data.field_0 >> 0x18 & 0xff) * 8 + (ulong)table->aux_offset);
  pMVar5 = (MessageLite *)*plVar17;
  if (pMVar5 == (MessageLite *)0x0) {
    arena = (Arena *)(msg->_internal_metadata_).ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    pMVar5 = ClassData::New(*(ClassData **)(lVar2 + 0x20),arena);
    *plVar17 = (long)pMVar5;
  }
  iVar16 = ctx->depth_;
  local_38 = (long)iVar16 + -1;
  ctx->depth_ = (int)local_38;
  if ((long)iVar16 < 1) {
    puVar11 = (ushort *)0x0;
  }
  else {
    local_58[0] = (ushort *)(ptr + 2);
    local_40 = (long)ctx->group_depth_;
    local_48 = local_40 + 1;
    ctx->group_depth_ = (int)local_48;
    while (bVar3 = EpsCopyInputStream::DoneWithCheck
                             (&ctx->super_EpsCopyInputStream,(char **)local_58,ctx->group_depth_),
          !bVar3) {
      uVar4 = (uint)*(byte *)(lVar2 + 8) & (uint)*local_58[0];
      if ((uVar4 & 7) != 0) {
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x44d);
      }
      uVar6 = (ulong)(uVar4 & 0xfffffff8);
      local_58[0] = (ushort *)
                    (**(code **)(lVar2 + 0x38 + uVar6 * 2))
                              (pMVar5,local_58[0],ctx,
                               (ulong)*local_58[0] ^ *(ulong *)(lVar2 + 0x40 + uVar6 * 2),lVar2,0);
      if ((local_58[0] == (ushort *)0x0) || ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0)
         ) break;
    }
    puVar9 = local_58[0];
    if ((*(byte *)(lVar2 + 9) & 1) != 0) {
      puVar9 = (ushort *)(**(code **)(lVar2 + 0x28))(pMVar5,local_58[0],ctx);
    }
    if (puVar9 == (ushort *)0x0) {
      iVar10 = ctx->group_depth_ + -1;
      iVar16 = ctx->depth_ + 1;
    }
    else {
      if ((int)local_38 != ctx->depth_) {
        psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                           (local_38,(long)ctx->depth_,"old_depth == depth_");
        uVar15 = *(undefined8 *)psVar7;
        uVar12 = *(undefined8 *)(psVar7 + 8);
        uVar14 = 0x45b;
LAB_0028ce45:
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_58,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/parse_context.h"
                   ,uVar14,uVar12,uVar15);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)local_58);
      }
      iVar10 = (int)local_40;
      if ((int)local_48 != ctx->group_depth_) {
        psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                           (local_48,(long)ctx->group_depth_,"old_group_depth == group_depth_");
        uVar15 = *(undefined8 *)psVar7;
        uVar12 = *(undefined8 *)(psVar7 + 8);
        uVar14 = 0x45c;
        goto LAB_0028ce45;
      }
    }
    ctx->group_depth_ = iVar10;
    ctx->depth_ = iVar16;
    uVar4 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
    (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
    puVar11 = (ushort *)0x0;
    if (uVar4 == (int)(char)uVar1 + (uint)uVar1 >> 1) {
      puVar11 = puVar9;
    }
  }
  return (char *)puVar11;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastGtS2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularParseMessageAuxImpl<uint16_t, true, true>(
      PROTOBUF_TC_PARAM_PASS);
}